

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccmake.cxx
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  long lVar6;
  ostream *poVar7;
  cmCursesMainForm *this;
  char *pcVar8;
  void *this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar9;
  int local_5bc;
  int local_59c;
  uint local_550;
  uint local_54c;
  cmCursesMainForm *myform;
  int y;
  int x;
  string local_4b8 [8];
  string arg;
  string cacheDir;
  value_type local_470;
  undefined1 local_450 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  uint local_430;
  int j;
  uint i;
  bool debug;
  string local_420;
  undefined1 local_400 [8];
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> generators;
  string local_3e0;
  allocator local_3b9;
  string local_3b8;
  undefined1 local_398 [8];
  cmake hcm;
  cmDocumentation doc;
  undefined1 local_30 [8];
  CommandLineArguments encoding_args;
  char **argv_local;
  int argc_local;
  
  encoding_args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = argv;
  cmsys::Encoding::CommandLineArguments::Main((CommandLineArguments *)local_30,argc,argv);
  iVar2 = cmsys::Encoding::CommandLineArguments::argc((CommandLineArguments *)local_30);
  encoding_args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       cmsys::Encoding::CommandLineArguments::argv((CommandLineArguments *)local_30);
  cmSystemTools::FindCMakeResources
            (*encoding_args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cmDocumentation::cmDocumentation((cmDocumentation *)&hcm.CurrentSnapshot.Position.Position);
  cmDocumentation::addCMakeStandardDocSections
            ((cmDocumentation *)&hcm.CurrentSnapshot.Position.Position);
  bVar1 = cmDocumentation::CheckOptions
                    ((cmDocumentation *)&hcm.CurrentSnapshot.Position.Position,iVar2,
                     encoding_args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage,(char *)0x0);
  if (bVar1) {
    cmake::cmake((cmake *)local_398);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3b8,"",&local_3b9);
    cmake::SetHomeDirectory((cmake *)local_398,&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_3e0,"",
               (allocator *)
               ((long)&generators.
                       super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmake::SetHomeOutputDirectory((cmake *)local_398,&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&generators.
                       super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmake::AddCMakePaths((cmake *)local_398);
    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::vector
              ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_400);
    cmake::GetGeneratorDocumentation
              ((cmake *)local_398,
               (vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_400);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_420,"ccmake",(allocator *)&debug);
    cmDocumentation::SetName((cmDocumentation *)&hcm.CurrentSnapshot.Position.Position,&local_420);
    std::__cxx11::string::~string((string *)&local_420);
    std::allocator<char>::~allocator((allocator<char> *)&debug);
    cmDocumentation::SetSection
              ((cmDocumentation *)&hcm.CurrentSnapshot.Position.Position,"Name",cmDocumentationName)
    ;
    cmDocumentation::SetSection
              ((cmDocumentation *)&hcm.CurrentSnapshot.Position.Position,"Usage",
               cmDocumentationUsage);
    if (iVar2 == 1) {
      cmDocumentation::AppendSection
                ((cmDocumentation *)&hcm.CurrentSnapshot.Position.Position,"Usage",
                 cmDocumentationUsageNote);
    }
    cmDocumentation::SetSection
              ((cmDocumentation *)&hcm.CurrentSnapshot.Position.Position,"Generators",
               (vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_400);
    cmDocumentation::PrependSection
              ((cmDocumentation *)&hcm.CurrentSnapshot.Position.Position,"Options",
               cmDocumentationOptions);
    bVar1 = cmDocumentation::PrintRequestedDocumentation
                      ((cmDocumentation *)&hcm.CurrentSnapshot.Position.Position,
                       (ostream *)&std::cout);
    argv_local._4_4_ = (uint)!bVar1;
    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector
              ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_400);
    cmake::~cmake((cmake *)local_398);
  }
  else {
    bVar1 = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_450);
    uVar9 = extraout_RDX;
    for (args.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < iVar2;
        args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             args.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      iVar3 = strcmp(encoding_args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage
                     [args.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_],"-debug");
      if (iVar3 == 0) {
        bVar1 = true;
        uVar9 = extraout_RDX_00;
      }
      else {
        pcVar8 = encoding_args.argv_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage
                 [args.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_];
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_470,pcVar8,(allocator *)(cacheDir.field_2._M_local_buf + 0xf));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_450,&local_470);
        std::__cxx11::string::~string((string *)&local_470);
        std::allocator<char>::~allocator((allocator<char> *)(cacheDir.field_2._M_local_buf + 0xf));
        uVar9 = extraout_RDX_01;
      }
    }
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              ((string *)((long)&arg.field_2 + 8),(SystemTools *)0x1,SUB81(uVar9,0));
    for (local_430 = 1;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_450), local_430 < sVar4; local_430 = local_430 + 1) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_450,(ulong)local_430);
      std::__cxx11::string::string(local_4b8,(string *)pvVar5);
      lVar6 = std::__cxx11::string::find((char *)local_4b8,0x8f44aa);
      if (lVar6 == 0) {
        std::__cxx11::string::substr((ulong)&y,(ulong)local_4b8);
        std::__cxx11::string::operator=((string *)(arg.field_2._M_local_buf + 8),(string *)&y);
        std::__cxx11::string::~string((string *)&y);
      }
      std::__cxx11::string::~string(local_4b8);
    }
    cmSystemTools::DisableRunCommandOutput();
    if (bVar1) {
      cmCursesForm::DebugStart();
    }
    initscr();
    noecho();
    cbreak();
    keypad(_stdscr,1);
    signal(0x1c,onsig);
    if (_stdscr == 0) {
      local_54c = 0xffffffff;
      local_550 = 0xffffffff;
    }
    else {
      local_54c = (int)*(short *)(_stdscr + 4) + 1;
      local_550 = (int)*(short *)(_stdscr + 6) + 1;
    }
    if (((int)local_550 < 0x41) || ((int)local_54c < 6)) {
      endwin();
      poVar7 = std::operator<<((ostream *)&std::cerr,"Window is too small. A size of at least ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x41);
      poVar7 = std::operator<<(poVar7," x ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,6);
      poVar7 = std::operator<<(poVar7," is required to run ccmake.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
    }
    else {
      this = (cmCursesMainForm *)operator_new(0x110);
      cmCursesMainForm::cmCursesMainForm
                (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_450,local_550);
      pcVar8 = (char *)std::__cxx11::string::c_str();
      iVar2 = cmCursesMainForm::LoadCache(this,pcVar8);
      if (iVar2 == 0) {
        cmSystemTools::SetMessageCallback(CMakeMessageHandler,this);
        cmCursesForm::CurrentForm = (cmCursesForm *)this;
        cmCursesMainForm::InitializeUI(this);
        iVar2 = cmCursesMainForm::Configure(this,1);
        if (iVar2 == 0) {
          (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])
                    (this,1,1,(ulong)local_550,(ulong)local_54c);
          (*(this->super_cmCursesForm)._vptr_cmCursesForm[2])();
        }
        curses_clear();
        if (_stdscr == 0) {
          local_5bc = -1;
        }
        else {
          local_5bc = *(short *)(_stdscr + 4) + 1;
        }
        wtouchln(_stdscr,0,local_5bc,1);
        endwin();
        if (cmCursesForm::CurrentForm != (cmCursesForm *)0x0) {
          (*cmCursesForm::CurrentForm->_vptr_cmCursesForm[1])();
        }
        cmCursesForm::CurrentForm = (cmCursesForm *)0x0;
        this_00 = (void *)std::ostream::operator<<
                                    (&std::cout,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 0;
      }
      else {
        curses_clear();
        if (_stdscr == 0) {
          local_59c = -1;
        }
        else {
          local_59c = *(short *)(_stdscr + 4) + 1;
        }
        wtouchln(_stdscr,0,local_59c,1);
        endwin();
        if (this != (cmCursesMainForm *)0x0) {
          (*(this->super_cmCursesForm)._vptr_cmCursesForm[1])();
        }
        std::operator<<((ostream *)&std::cerr,"Error running cmake::LoadCache().  Aborting.\n");
        argv_local._4_4_ = 1;
      }
    }
    std::__cxx11::string::~string((string *)(arg.field_2._M_local_buf + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_450);
  }
  cmDocumentation::~cmDocumentation((cmDocumentation *)&hcm.CurrentSnapshot.Position.Position);
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments((CommandLineArguments *)local_30);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char const* const* argv)
{
  cmsys::Encoding::CommandLineArguments encoding_args =
    cmsys::Encoding::CommandLineArguments::Main(argc, argv);
  argc = encoding_args.argc();
  argv = encoding_args.argv();

  cmSystemTools::FindCMakeResources(argv[0]);
  cmDocumentation doc;
  doc.addCMakeStandardDocSections();
  if(doc.CheckOptions(argc, argv))
    {
    cmake hcm;
    hcm.SetHomeDirectory("");
    hcm.SetHomeOutputDirectory("");
    hcm.AddCMakePaths();
    std::vector<cmDocumentationEntry> generators;
    hcm.GetGeneratorDocumentation(generators);
    doc.SetName("ccmake");
    doc.SetSection("Name",cmDocumentationName);
    doc.SetSection("Usage",cmDocumentationUsage);
    if ( argc == 1 )
      {
      doc.AppendSection("Usage",cmDocumentationUsageNote);
      }
    doc.SetSection("Generators",generators);
    doc.PrependSection("Options",cmDocumentationOptions);
    return doc.PrintRequestedDocumentation(std::cout)? 0:1;
    }

  bool debug = false;
  unsigned int i;
  int j;
  std::vector<std::string> args;
  for(j =0; j < argc; ++j)
    {
    if(strcmp(argv[j], "-debug") == 0)
      {
      debug = true;
      }
    else
      {
      args.push_back(argv[j]);
      }
    }

  std::string cacheDir = cmSystemTools::GetCurrentWorkingDirectory();
  for(i=1; i < args.size(); ++i)
    {
    std::string arg = args[i];
    if(arg.find("-B",0) == 0)
      {
      cacheDir = arg.substr(2);
      }
    }

  cmSystemTools::DisableRunCommandOutput();

  if (debug)
    {
    cmCursesForm::DebugStart();
    }

  initscr(); /* Initialization */
  noecho(); /* Echo off */
  cbreak(); /* nl- or cr not needed */
  keypad(stdscr,TRUE); /* Use key symbols as
                          KEY_DOWN*/

  signal(SIGWINCH, onsig);

  int x,y;
  getmaxyx(stdscr, y, x);
  if ( x < cmCursesMainForm::MIN_WIDTH  ||
       y < cmCursesMainForm::MIN_HEIGHT )
    {
    endwin();
    std::cerr << "Window is too small. A size of at least "
              << cmCursesMainForm::MIN_WIDTH << " x "
              <<  cmCursesMainForm::MIN_HEIGHT
              << " is required to run ccmake." <<  std::endl;
    return 1;
    }


  cmCursesMainForm* myform;

  myform = new cmCursesMainForm(args, x);
  if(myform->LoadCache(cacheDir.c_str()))
    {
    curses_clear();
    touchwin(stdscr);
    endwin();
    delete myform;
    std::cerr << "Error running cmake::LoadCache().  Aborting.\n";
    return 1;
    }

  cmSystemTools::SetMessageCallback(CMakeMessageHandler, myform);

  cmCursesForm::CurrentForm = myform;

  myform->InitializeUI();
  if ( myform->Configure(1) == 0 )
    {
    myform->Render(1, 1, x, y);
    myform->HandleInput();
    }

  // Need to clean-up better
  curses_clear();
  touchwin(stdscr);
  endwin();
  delete cmCursesForm::CurrentForm;
  cmCursesForm::CurrentForm = 0;

  std::cout << std::endl << std::endl;

  return 0;

}